

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryContextTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::QueryAPICase::iterate(QueryAPICase *this)

{
  ostringstream *this_00;
  ostringstream *this_01;
  TestLog *pTVar1;
  bool bVar2;
  EGLenum EVar3;
  EGLenum EVar4;
  Library *egl;
  EGLDisplay display;
  long lVar5;
  EGLenum api;
  QueryAPICase *local_1f0;
  Enum<int,_2UL> local_1e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> supportedAPIs;
  MessageBuilder local_1b0;
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  display = eglu::getAndInitDisplay
                      ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                       super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                       .m_data.ptr,(Version *)0x0);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  eglu::getClientAPIs(&supportedAPIs,egl,display);
  (this->super_CallLogWrapper).m_enableLog = true;
  local_1f0 = this;
  EVar3 = eglu::CallLogWrapper::eglQueryAPI(&this->super_CallLogWrapper);
  if (EVar3 == 0x30a0) {
LAB_00233a2d:
    local_1b0.m_log =
         (TestLog *)
         supportedAPIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_1e8.m_getName =
         (GetNameFunc)
         supportedAPIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    api = 0x30a0;
    bVar2 = de::
            contains<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                      ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&local_1b0,
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&local_1e8,(int *)&api);
    if (bVar2) goto LAB_00233b17;
    local_1b0.m_log = pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    std::operator<<((ostream *)&local_1b0.m_str,
                    "  Fail, initial value should be EGL_NONE if OpenGL ES is not supported.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b0.m_log =
         (TestLog *)
         supportedAPIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_1e8.m_getName =
         (GetNameFunc)
         supportedAPIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    api = 0x30a0;
    bVar2 = de::
            contains<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                      ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&local_1b0,
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&local_1e8,(int *)&api);
    if (!bVar2) {
      if (EVar3 == 0x3038) goto LAB_00233b17;
      goto LAB_00233a2d;
    }
    local_1b0.m_log = pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    std::operator<<((ostream *)&local_1b0.m_str,
                    "  Fail, initial value should be EGL_OPENGL_ES_API if OpenGL ES is supported.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  tcu::TestContext::setTestResult
            ((local_1f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL
             ,"Invalid default value");
LAB_00233b17:
  this_00 = &local_1b0.m_str;
  for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 4) {
    api = *(EGLenum *)((long)&DAT_00333668 + lVar5);
    local_1b0.m_log = pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
    local_1b0.m_log =
         (TestLog *)
         supportedAPIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_1e8.m_getName =
         (GetNameFunc)
         supportedAPIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    bVar2 = de::
            contains<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                      ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&local_1b0,
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&local_1e8,&api);
    if (bVar2) {
      (**egl->_vptr_Library)(egl,(ulong)api);
      EVar3 = api;
      EVar4 = (*egl->_vptr_Library[0x28])(egl);
      if (EVar3 != EVar4) {
        this_01 = &local_1b0.m_str;
        local_1b0.m_log = pTVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
        std::operator<<((ostream *)this_01,
                        "  Fail, return value does not match previously bound API.");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
        tcu::TestContext::setTestResult
                  ((local_1f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid return value");
      }
    }
    else {
      local_1b0.m_log = pTVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      local_1e8.m_getName = eglu::getAPIName;
      local_1e8.m_value = api;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1e8,(ostream *)this_00);
      std::operator<<((ostream *)this_00," not supported.");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    }
  }
  (local_1f0->super_CallLogWrapper).m_enableLog = false;
  eglu::CallLogWrapper::eglTerminate(&this->super_CallLogWrapper,display);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&supportedAPIs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const Library&			egl				= m_eglTestCtx.getLibrary();
		EGLDisplay				display			= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
		tcu::TestLog&			log				= m_testCtx.getLog();
		const EGLenum			apis[]			= { EGL_OPENGL_API, EGL_OPENGL_ES_API, EGL_OPENVG_API };
		const vector<EGLenum>	supportedAPIs	= eglu::getClientAPIs(egl, display);

		enableLogging(true);

		{
			const EGLenum	api	= eglQueryAPI();

			if (api != EGL_OPENGL_ES_API && (de::contains(supportedAPIs.begin(), supportedAPIs.end(), EGL_OPENGL_ES_API)))
			{
				log << TestLog::Message << "  Fail, initial value should be EGL_OPENGL_ES_API if OpenGL ES is supported." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid default value");
			}
			else if (api != EGL_NONE && !(de::contains(supportedAPIs.begin(), supportedAPIs.end(), EGL_OPENGL_ES_API)))
			{
				log << TestLog::Message << "  Fail, initial value should be EGL_NONE if OpenGL ES is not supported." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid default value");
			}
		}

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(apis); ndx++)
		{
			const EGLenum	api	= apis[ndx];

			log << TestLog::Message << TestLog::EndMessage;

			if (de::contains(supportedAPIs.begin(), supportedAPIs.end(), api))
			{
				egl.bindAPI(api);

				if (api != egl.queryAPI())
				{
					log << TestLog::Message << "  Fail, return value does not match previously bound API." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid return value");
				}
			}
			else
			{
				log << TestLog::Message << eglu::getAPIStr(api) << " not supported." << TestLog::EndMessage;
			}
		}

		enableLogging(false);
		eglTerminate(display);
		return STOP;
	}